

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

void __thiscall transaction_tests::tx_oversized::test_method(tx_oversized *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  bool bVar3;
  int iVar4;
  size_t in_RDX;
  size_t payloadSize;
  size_t payloadSize_00;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  TxValidationState state;
  check_type cVar7;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  lazy_ostream local_158;
  undefined1 *local_148;
  char **local_140;
  assertion_result local_138;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  TxValidationState local_100;
  undefined1 local_b8 [16];
  undefined1 local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  test_method::anon_class_1_0_00000001::operator()
            ((CTransaction *)local_b8,(anon_class_1_0_00000001 *)0xf4240,in_RDX);
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&local_158;
  local_158._vptr_lazy_ostream = (_func_int **)0x0;
  local_100.super_ValidationState<TxValidationResult>._0_8_ = &::TX_NO_WITNESS;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            ((CTransaction *)local_b8,
             (ParamsStream<SizeComputer_&,_TransactionSerParams> *)&local_100,&::TX_NO_WITNESS);
  pp_Var2 = local_158._vptr_lazy_ostream;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_a8 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
  paVar1 = &local_100.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  local_100.super_ValidationState<TxValidationResult>._0_8_ = (TransactionSerParams *)0x0;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0'
  ;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0'
  ;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar1;
  test_method::anon_class_1_0_00000001::operator()
            ((CTransaction *)local_b8,(anon_class_1_0_00000001 *)(&LAB_001e847d_3 + -(long)pp_Var2),
             payloadSize);
  CheckTransaction((CTransaction *)local_b8,&local_100);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_a8 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x18e;
  file.m_begin = (iterator)&local_110;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p,
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p +
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "bad-txns-oversize");
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 != 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = "state.GetRejectReason() != \"bad-txns-oversize\"";
  local_160 = "";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_170 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_140 = &local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,0,WARN,_cVar7,(size_t)&local_178,0x18e);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  if ((pointer)local_b8._0_8_ != (pointer)local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
      &local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                    _M_p,CONCAT71(local_100.super_ValidationState<TxValidationResult>.
                                  m_debug_message.field_2._M_allocated_capacity._1_7_,
                                  local_100.super_ValidationState<TxValidationResult>.
                                  m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p !=
      paVar1) {
    operator_delete(local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                    _M_p,CONCAT71(local_100.super_ValidationState<TxValidationResult>.
                                  m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                  local_100.super_ValidationState<TxValidationResult>.
                                  m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  local_100.super_ValidationState<TxValidationResult>._0_8_ = (TransactionSerParams *)0x0;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0'
  ;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0'
  ;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x194;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)paVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  test_method::anon_class_1_0_00000001::operator()
            ((CTransaction *)local_b8,(anon_class_1_0_00000001 *)(&LAB_001e8481 + -(long)pp_Var2),
             payloadSize_00);
  bVar3 = CheckTransaction((CTransaction *)local_b8,&local_100);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d7350;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (char **)0xf6dd4a;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1a0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,1,WARN,_cVar7,(size_t)&local_1a8,0x194);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_a8 + 8));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_b8);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x195;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p,
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p +
             local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "bad-txns-oversize");
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = "state.GetRejectReason() == \"bad-txns-oversize\"";
  local_160 = "";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1d0 = "";
  local_140 = &local_168;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,0,WARN,_cVar7,(size_t)&local_1d8,0x195);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  if ((pointer)local_b8._0_8_ != (pointer)local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p !=
      &local_100.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
    operator_delete(local_100.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                    _M_p,CONCAT71(local_100.super_ValidationState<TxValidationResult>.
                                  m_debug_message.field_2._M_allocated_capacity._1_7_,
                                  local_100.super_ValidationState<TxValidationResult>.
                                  m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p !=
      paVar1) {
    operator_delete(local_100.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                    _M_p,CONCAT71(local_100.super_ValidationState<TxValidationResult>.
                                  m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                  local_100.super_ValidationState<TxValidationResult>.
                                  m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_oversized)
{
    auto createTransaction =[](size_t payloadSize) {
        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vout.emplace_back(1, CScript() << OP_RETURN << std::vector<unsigned char>(payloadSize));
        return CTransaction(tx);
    };
    const auto maxTransactionSize = MAX_BLOCK_WEIGHT / WITNESS_SCALE_FACTOR;
    const auto oversizedTransactionBaseSize = ::GetSerializeSize(TX_NO_WITNESS(createTransaction(maxTransactionSize))) - maxTransactionSize;

    auto maxPayloadSize = maxTransactionSize - oversizedTransactionBaseSize;
    {
        TxValidationState state;
        CheckTransaction(createTransaction(maxPayloadSize), state);
        BOOST_CHECK(state.GetRejectReason() != "bad-txns-oversize");
    }

    maxPayloadSize += 1;
    {
        TxValidationState state;
        BOOST_CHECK_MESSAGE(!CheckTransaction(createTransaction(maxPayloadSize), state), "Oversized transaction should be invalid");
        BOOST_CHECK(state.GetRejectReason() == "bad-txns-oversize");
    }
}